

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack8.h
# Opt level: O1

void ncnn::pooling2x2s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [32];
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  int iVar12;
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->w;
    iVar3 = top_blob->h;
    lVar8 = (long)((bottom_blob->w - iVar2) * 0x10);
    lVar9 = 0;
    do {
      if (0 < iVar3) {
        pauVar10 = (undefined1 (*) [32])
                   (top_blob->cstep * lVar9 * top_blob->elemsize + (long)top_blob->data);
        pauVar11 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar6 = (undefined1 (*) [32])(*pauVar11 + (long)bottom_blob->w * bottom_blob->elemsize);
        iVar7 = 0;
        do {
          iVar12 = iVar2;
          if (0 < iVar2) {
            do {
              auVar4 = vmaxps_avx(*pauVar11,pauVar11[1]);
              auVar5 = vmaxps_avx(*pauVar6,pauVar6[1]);
              auVar4 = vmaxps_avx(auVar4,auVar5);
              *pauVar10 = auVar4;
              pauVar11 = pauVar11 + 2;
              pauVar6 = pauVar6 + 2;
              pauVar10 = pauVar10 + 1;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + lVar8 * 4);
          pauVar6 = (undefined1 (*) [32])(*pauVar6 + lVar8 * 4);
          iVar7 = iVar7 + 1;
        } while (iVar7 != iVar3);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                __m256 _max1 = _mm256_max_ps(_r10, _r11);
                __m256 _max = _mm256_max_ps(_max0, _max1);

                _mm256_storeu_ps(outptr, _max);

                r0 += 16;
                r1 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}